

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  global_State *pgVar1;
  bool bVar2;
  int iVar3;
  GCObject *pGVar4;
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  GCObject *unaff_R12;
  TString *ts;
  
  if (l == 0) {
    uVar7 = 0;
  }
  else {
    uVar8 = l & 0xffffffff;
    sVar6 = l;
    do {
      uVar7 = (uint)uVar8 ^ (uint)(byte)str[sVar6 - 1] + (int)(uVar8 >> 2) + (uint)uVar8 * 0x20;
      uVar8 = (ulong)uVar7;
      sVar6 = sVar6 + ~(l >> 5);
    } while (l >> 5 < sVar6);
  }
  pGVar4 = (GCObject *)((L->l_G->strt).hash + ((long)(int)uVar7 & (long)(L->l_G->strt).size - 1U));
  while (pGVar4 = (pGVar4->gch).next, pGVar4 != (GCObject *)0x0) {
    bVar2 = true;
    if (((pGVar4->h).metatable == (Table *)l) && (iVar3 = bcmp(str,&pGVar4->ts + 1,l), iVar3 == 0))
    {
      if ((~L->l_G->currentwhite & (pGVar4->gch).marked & 3) != 0) {
        (pGVar4->gch).marked = (pGVar4->gch).marked ^ 3;
      }
      bVar2 = false;
      unaff_R12 = pGVar4;
    }
    if (!bVar2) {
      return (TString *)unaff_R12;
    }
  }
  if (l + 0x1b < 0x1a) {
    luaG_runerror(L,"memory allocation error: block too big");
  }
  pGVar4 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,l + 0x19);
  (pGVar4->h).metatable = (Table *)l;
  *(uint *)((long)pGVar4 + 0xc) = uVar7;
  (pGVar4->gch).marked = L->l_G->currentwhite & 3;
  (pGVar4->gch).tt = '\x04';
  (pGVar4->h).flags = '\0';
  memcpy(&pGVar4->ts + 1,str,l);
  *(undefined1 *)((long)pGVar4 + l + 0x18) = 0;
  pgVar1 = L->l_G;
  uVar7 = (pgVar1->strt).size - 1U & uVar7;
  (pGVar4->gch).next = (pgVar1->strt).hash[uVar7];
  (pgVar1->strt).hash[uVar7] = pGVar4;
  uVar7 = (pgVar1->strt).size;
  uVar5 = (pgVar1->strt).nuse + 1;
  (pgVar1->strt).nuse = uVar5;
  if (0x3ffffffe < (int)uVar7 || uVar5 <= uVar7) {
    return (TString *)pGVar4;
  }
  luaS_resize(L,uVar7 * 2);
  return (TString *)pGVar4;
}

Assistant:

static TString*luaS_newlstr(lua_State*L,const char*str,size_t l){
GCObject*o;
unsigned int h=cast(unsigned int,l);
size_t step=(l>>5)+1;
size_t l1;
for(l1=l;l1>=step;l1-=step)
h=h^((h<<5)+(h>>2)+cast(unsigned char,str[l1-1]));
for(o=G(L)->strt.hash[lmod(h,G(L)->strt.size)];
o!=NULL;
o=o->gch.next){
TString*ts=rawgco2ts(o);
if(ts->tsv.len==l&&(memcmp(str,getstr(ts),l)==0)){
if(isdead(G(L),o))changewhite(o);
return ts;
}
}
return newlstr(L,str,l,h);
}